

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O3

cTValue * lj_tab_get(lua_State *L,GCtab *t,cTValue *key)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  cTValue *pcVar4;
  
  uVar2 = (key->field_2).it;
  if (uVar2 == 0xfffffffb) {
    pcVar4 = (cTValue *)
             ((ulong)(t->node).ptr32 +
             (ulong)(t->hmask & *(uint *)((ulong)(key->u32).lo + 8)) * 0x18);
    do {
      if ((*(int *)((long)pcVar4 + 0xc) == -5) && (pcVar4[1].u32.lo == (key->u32).lo)) {
        return pcVar4;
      }
      pcVar4 = (cTValue *)(ulong)pcVar4[2].u32.lo;
    } while (pcVar4 != (cTValue *)0x0);
  }
  else {
    if (uVar2 < 0xfffeffff) {
      dVar1 = key->n;
      if ((dVar1 == (double)(int)dVar1) && (!NAN(dVar1) && !NAN((double)(int)dVar1))) {
        uVar2 = (uint)dVar1;
        if (uVar2 < t->asize) {
          pcVar4 = (cTValue *)((ulong)(t->array).ptr32 + (long)(int)uVar2 * 8);
        }
        else {
          pcVar4 = lj_tab_getinth(t,uVar2);
        }
        if (pcVar4 != (cTValue *)0x0) {
          return pcVar4;
        }
        goto LAB_0011cf83;
      }
    }
    else if (uVar2 == 0xffffffff) goto LAB_0011cf83;
    pcVar4 = &hashkey(t,key)->val;
    do {
      iVar3 = lj_obj_equal(pcVar4 + 1,key);
      if (iVar3 != 0) {
        return pcVar4;
      }
      pcVar4 = (cTValue *)(ulong)pcVar4[2].u32.lo;
    } while (pcVar4 != (cTValue *)0x0);
  }
LAB_0011cf83:
  return (cTValue *)((ulong)(L->glref).ptr32 + 0x130);
}

Assistant:

cTValue *lj_tab_get(lua_State *L, GCtab *t, cTValue *key)
{
  if (tvisstr(key)) {
    cTValue *tv = lj_tab_getstr(t, strV(key));
    if (tv)
      return tv;
  } else if (tvisint(key)) {
    cTValue *tv = lj_tab_getint(t, intV(key));
    if (tv)
      return tv;
  } else if (tvisnum(key)) {
    lua_Number nk = numV(key);
    int32_t k = lj_num2int(nk);
    if (nk == (lua_Number)k) {
      cTValue *tv = lj_tab_getint(t, k);
      if (tv)
	return tv;
    } else {
      goto genlookup;  /* Else use the generic lookup. */
    }
  } else if (!tvisnil(key)) {
    Node *n;
  genlookup:
    n = hashkey(t, key);
    do {
      if (lj_obj_equal(&n->key, key))
	return &n->val;
    } while ((n = nextnode(n)));
  }
  return niltv(L);
}